

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::ExprMixin<(wabt::ExprType)28>,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)28>_>_>
 wabt::MakeUnique<wabt::ExprMixin<(wabt::ExprType)28>>(void)

{
  undefined8 *puVar1;
  __uniq_ptr_data<wabt::ExprMixin<(wabt::ExprType)28>,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)28>_>,_true,_true>
  in_RDI;
  
  puVar1 = (undefined8 *)operator_new(0x40);
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined8 *)((long)puVar1 + 0x24) = 0;
  *(undefined8 *)((long)puVar1 + 0x2c) = 0;
  *(undefined4 *)(puVar1 + 7) = 0x1c;
  *puVar1 = &PTR__Expr_001b1508;
  *(undefined8 **)
   in_RDI.
   super___uniq_ptr_impl<wabt::ExprMixin<(wabt::ExprType)28>,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)28>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_wabt::ExprMixin<(wabt::ExprType)28>_*,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)28>_>_>
   .super__Head_base<0UL,_wabt::ExprMixin<(wabt::ExprType)28>_*,_false>._M_head_impl = puVar1;
  return (__uniq_ptr_data<wabt::ExprMixin<(wabt::ExprType)28>,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)28>_>,_true,_true>
          )(tuple<wabt::ExprMixin<(wabt::ExprType)28>_*,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)28>_>_>
            )in_RDI.
             super___uniq_ptr_impl<wabt::ExprMixin<(wabt::ExprType)28>,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)28>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::ExprMixin<(wabt::ExprType)28>_*,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)28>_>_>
             .super__Head_base<0UL,_wabt::ExprMixin<(wabt::ExprType)28>_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}